

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ComponentManifestItem_PRIVATE * __thiscall
ON_ComponentManifestTableIndex::SystemItemFromIndex
          (ON_ComponentManifestTableIndex *this,int sytem_item_index)

{
  ON_ComponentManifestItem_PRIVATE *pOVar1;
  ON_ComponentManifestItem_PRIVATE **ppOVar2;
  
  if ((0x80000001 < (uint)sytem_item_index) && (this->m_bIndexedComponent != false)) {
    ppOVar2 = &this->m_first_system_item;
    while (pOVar1 = *ppOVar2, pOVar1 != (ON_ComponentManifestItem_PRIVATE *)0x0) {
      if ((pOVar1->super_ON_ComponentManifestItem).m_index == sytem_item_index) {
        return pOVar1;
      }
      ppOVar2 = &pOVar1->m_next;
    }
  }
  return (ON_ComponentManifestItem_PRIVATE *)0x0;
}

Assistant:

const ON_ComponentManifestItem_PRIVATE* ON_ComponentManifestTableIndex::SystemItemFromIndex(
  int sytem_item_index
  ) const
{
  if (m_bIndexedComponent && sytem_item_index < 0 && sytem_item_index > ON_UNSET_INT_INDEX )
  {
    // The linked list of system items is always short - hash tables and sorting are a waste of time
    for (const ON_ComponentManifestItem_PRIVATE* system_item = m_first_system_item; nullptr != system_item; system_item = system_item->m_next)
    {
      if ( system_item->Index() == sytem_item_index )
        return system_item;
    }
  }

  return nullptr;
}